

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakebuiltins.cpp
# Opt level: O2

void addJsonObject(QJsonObject *object,QString *keyPrefix,ProValueMap *map)

{
  qsizetype asize;
  ulong uVar1;
  long in_FS_OFFSET;
  const_iterator cVar2;
  QStringBuilder<const_QString_&,_const_QString_&> local_d0;
  QArrayDataPointer<char16_t> local_c0;
  anon_union_8_3_4e90986c_for_QJsonValueConstRef_0 local_a8;
  ulong uStack_a0;
  QArrayDataPointer<char16_t> local_98;
  anon_union_8_3_4e90986c_for_QJsonValueConstRef_0 local_78;
  ulong uStack_70;
  QArrayDataPointer<QString> local_68;
  QStringBuilder<const_QString_&,_QLatin1String> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.d = (Data *)0x0;
  local_68.ptr = (QString *)0x0;
  local_68.size = 0;
  asize = QJsonObject::size();
  QList<QString>::reserve((QList<QString> *)&local_68,asize);
  uStack_70 = 1;
  local_78.o = object;
  cVar2 = QJsonObject::end(object);
  uVar1 = 1;
  while ((object != (QJsonObject *)cVar2.item.field_0.a || (1 < (uVar1 ^ cVar2.item._8_8_)))) {
    local_98.size = -0x5555555555555556;
    local_98.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_98.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    QJsonValueConstRef::objectKey((QString *)&local_98,(QJsonValueConstRef *)&local_78);
    QList<QString>::emplaceBack<QString_const&>((QList<QString> *)&local_68,(QString *)&local_98);
    local_a8.a = local_78.a;
    uStack_a0 = uStack_70;
    QJsonValueConstRef::operator_cast_to_QJsonValue((QJsonValueConstRef *)&local_50);
    local_d0.a = keyPrefix;
    local_d0.b = (QString *)&local_98;
    QStringBuilder<const_QString_&,_const_QString_&>::convertTo<QString>
              ((QString *)&local_c0,&local_d0);
    addJsonValue((QJsonValue *)&local_50,(QString *)&local_c0,map);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c0);
    QJsonValue::~QJsonValue((QJsonValue *)&local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
    uVar1 = uStack_70 + 2;
    object = local_78.o;
    uStack_70 = uVar1;
  }
  local_50.b.m_size = QtPrivate::lengthHelperPointer<char>("_KEYS_");
  local_50.b.m_data = "_KEYS_";
  local_50.a = keyPrefix;
  QStringBuilder<const_QString_&,_QLatin1String>::convertTo<QString>((QString *)&local_98,&local_50)
  ;
  insertJsonKeyValue((QString *)&local_98,(QStringList *)&local_68,map);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void addJsonObject(const QJsonObject &object, const QString &keyPrefix, ProValueMap *map)
{
    QStringList keys;
    keys.reserve(object.size());
    for (auto it = object.begin(), end = object.end(); it != end; ++it) {
        const QString key = it.key();
        keys.append(key);
        addJsonValue(it.value(), keyPrefix + key, map);
    }
    insertJsonKeyValue(keyPrefix + QLatin1String("_KEYS_"), keys, map);
}